

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForest(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *eps,
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,int *nonz,int n)

{
  int32_t iVar1;
  fpclass_type fVar2;
  fpclass_type fVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  undefined8 *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  fpclass_type fVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  byte bVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  undefined4 *puVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  uint *puVar22;
  undefined4 *puVar23;
  cpp_dec_float<200U,_int,_void> *pcVar24;
  bool bVar25;
  byte bVar26;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  int local_314;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [13];
  undefined3 uStack_29b;
  int iStack_298;
  bool bStack_294;
  undefined8 local_290;
  undefined1 local_288 [32];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [13];
  undefined3 uStack_21b;
  int iStack_218;
  bool bStack_214;
  undefined8 local_210;
  int *local_208;
  pointer local_200;
  int *local_1f8;
  int *local_1f0;
  int *local_1e8;
  long local_1e0;
  long local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  long local_1c8;
  int *local_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [13];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140 [2];
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar26 = 0;
  local_1f8 = nonz;
  local_1d0 = eps;
  local_210._0_4_ = cpp_dec_float_finite;
  local_210._4_4_ = 0x1c;
  local_288._0_16_ = (undefined1  [16])0x0;
  local_288._16_16_ = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_238 = (undefined1  [16])0x0;
  local_228 = SUB1613((undefined1  [16])0x0,0);
  uStack_21b = 0;
  iStack_218 = 0;
  bStack_214 = false;
  iVar9 = (this->l).firstUpdate;
  iVar11 = (this->l).firstUnused;
  local_1e0 = (long)iVar9;
  local_314 = n;
  if (iVar9 < iVar11) {
    local_200 = (this->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_208 = (this->l).idx;
    local_1e8 = (this->l).row;
    local_1f0 = (this->l).start;
    lVar15 = (long)iVar11;
    do {
      iVar9 = local_1e8[lVar15 + -1];
      pnVar18 = vec + iVar9;
      pcVar17 = &local_130;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar17->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar26 * -2 + 1) * 4);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_130.exp = vec[iVar9].m_backend.exp;
      local_130.neg = vec[iVar9].m_backend.neg;
      fVar2 = vec[iVar9].m_backend.fpclass;
      iVar5 = vec[iVar9].m_backend.prec_elem;
      local_130.fpclass = fVar2;
      local_130.prec_elem = iVar5;
      local_1d8 = lVar15 + -1;
      if (fVar2 == cpp_dec_float_NaN) {
LAB_0053ed84:
        lVar14 = (long)local_1f0[lVar15 + -1];
        iVar9 = local_1f0[lVar15];
        if (local_1f0[lVar15 + -1] < iVar9) {
          piVar13 = local_208 + lVar14;
          pcVar17 = &local_200[lVar14].m_backend;
          local_1c8 = lVar14;
          do {
            local_1c0 = piVar13;
            iVar11 = *piVar13;
            pnVar18 = vec + iVar11;
            pnVar21 = pnVar18;
            puVar22 = (uint *)local_288;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar22 = (pnVar21->m_backend).data._M_elems[0];
              pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar21 + ((ulong)bVar26 * -2 + 1) * 4);
              puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
            }
            iStack_218 = vec[iVar11].m_backend.exp;
            bStack_214 = vec[iVar11].m_backend.neg;
            fVar3 = vec[iVar11].m_backend.fpclass;
            iVar6 = vec[iVar11].m_backend.prec_elem;
            local_210._0_4_ = fVar3;
            local_210._4_4_ = iVar6;
            if (fVar3 == cpp_dec_float_NaN) {
LAB_0053ee32:
              local_290._0_4_ = cpp_dec_float_finite;
              local_290._4_4_ = 0x1c;
              local_308 = (undefined1  [16])0x0;
              local_2f8 = (undefined1  [16])0x0;
              local_2e8 = (undefined1  [16])0x0;
              local_2d8 = (undefined1  [16])0x0;
              local_2c8 = (undefined1  [16])0x0;
              local_2b8 = (undefined1  [16])0x0;
              local_2a8 = SUB1613((undefined1  [16])0x0,0);
              uStack_29b = 0;
              iStack_298 = 0;
              bStack_294 = false;
              pcVar20 = &local_130;
              if (pcVar17 != (cpp_dec_float<200U,_int,_void> *)local_308) {
                pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_308;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pcVar24->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
                  pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar20 + (ulong)bVar26 * -8 + 4);
                  pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar24 + (ulong)bVar26 * -8 + 4);
                }
                iStack_298 = local_130.exp;
                bStack_294 = local_130.neg;
                local_290._0_4_ = local_130.fpclass;
                local_290._4_4_ = local_130.prec_elem;
                pcVar20 = pcVar17;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_308,pcVar20);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_288,
                         (cpp_dec_float<200U,_int,_void> *)local_308);
              fVar12 = cpp_dec_float_NaN;
              if ((fpclass_type)local_210 == cpp_dec_float_NaN) {
LAB_0053ef2d:
                puVar19 = (undefined4 *)local_288;
                puVar23 = (undefined4 *)local_1b8;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  *puVar23 = *puVar19;
                  puVar19 = puVar19 + (ulong)bVar26 * -2 + 1;
                  puVar23 = puVar23 + (ulong)bVar26 * -2 + 1;
                }
                puVar8 = &local_210;
                iVar11 = iStack_218;
                bVar25 = bStack_214;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_308,0,(type *)0x0);
                iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_288,
                                    (cpp_dec_float<200U,_int,_void> *)local_308);
                if (iVar11 != 0) {
                  fVar12 = (fpclass_type)local_210;
                  goto LAB_0053ef2d;
                }
                local_140[0]._0_4_ = cpp_dec_float_finite;
                local_140[0]._4_4_ = 0x1c;
                local_1b8._0_16_ = (undefined1  [16])0x0;
                local_1b8._16_16_ = (undefined1  [16])0x0;
                local_198 = (undefined1  [16])0x0;
                local_188 = (undefined1  [16])0x0;
                local_178 = (undefined1  [16])0x0;
                local_168 = (undefined1  [16])0x0;
                local_158 = SUB1613((undefined1  [16])0x0,0);
                uStack_14b = 0;
                iStack_148 = 0;
                bStack_144 = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_1b8,1e-100);
                puVar8 = local_140;
                fVar12 = (fpclass_type)local_140[0];
                iVar11 = iStack_148;
                bVar25 = bStack_144;
              }
              iVar1 = *(int32_t *)((long)puVar8 + 4);
              puVar22 = (uint *)local_1b8;
              pnVar21 = pnVar18;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pnVar21->m_backend).data._M_elems[0] = *puVar22;
                puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
                pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar21 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              (pnVar18->m_backend).exp = iVar11;
              (pnVar18->m_backend).neg = bVar25;
              (pnVar18->m_backend).fpclass = fVar12;
              (pnVar18->m_backend).prec_elem = iVar1;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_308,0,(type *)0x0);
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_288,
                                  (cpp_dec_float<200U,_int,_void> *)local_308);
              if (iVar10 != 0) goto LAB_0053ee32;
              pcVar20 = &local_130;
              pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
              for (lVar15 = 0x1c; iVar10 = local_130.exp, lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar24->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar20 + ((ulong)bVar26 * -2 + 1) * 4);
                pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar26 * -8 + 4)
                ;
              }
              iStack_148 = local_130.exp;
              bStack_144 = local_130.neg;
              fVar12 = local_130.fpclass;
              iVar1 = local_130.prec_elem;
              local_140[0]._0_4_ = local_130.fpclass;
              local_140[0]._4_4_ = local_130.prec_elem;
              bVar16 = local_130.neg;
              if (local_1b8._0_4_ != 0 || fVar12 != cpp_dec_float_finite) {
                bVar16 = local_130.neg ^ 1;
                bStack_144 = (bool)bVar16;
              }
              local_290._0_4_ = cpp_dec_float_finite;
              local_290._4_4_ = 0x1c;
              local_308 = (undefined1  [16])0x0;
              local_2f8 = (undefined1  [16])0x0;
              local_2e8 = (undefined1  [16])0x0;
              local_2d8 = (undefined1  [16])0x0;
              local_2c8 = (undefined1  [16])0x0;
              local_2b8 = (undefined1  [16])0x0;
              local_2a8 = SUB1613((undefined1  [16])0x0,0);
              uStack_29b = 0;
              iStack_298 = 0;
              bStack_294 = false;
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
              bStack_144 = (bool)bVar16;
              if (pcVar17 != (cpp_dec_float<200U,_int,_void> *)local_308) {
                pcVar20 = &local_130;
                pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_308;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pcVar24->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
                  pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar20 + ((ulong)bVar26 * -2 + 1) * 4);
                  pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar24 + (ulong)bVar26 * -8 + 4);
                }
                iStack_298 = iVar10;
                local_290._0_4_ = fVar12;
                local_290._4_4_ = iVar1;
                pcVar20 = pcVar17;
                bStack_294 = (bool)bVar16;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_308,pcVar20);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_308;
              puVar22 = (uint *)local_288;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                *puVar22 = (pcVar20->data)._M_elems[0];
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar26 * -8 + 4)
                ;
                puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
              }
              iStack_218 = iStack_298;
              bStack_214 = bStack_294;
              local_210._0_4_ = (fpclass_type)local_290;
              local_210._4_4_ = local_290._4_4_;
              puVar22 = (uint *)local_288;
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_308;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar20->data)._M_elems[0] = *puVar22;
                puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar26 * -8 + 4)
                ;
              }
              pnVar21 = local_1d0;
              pcVar20 = &local_b0;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar20->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
                pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar21 + ((ulong)bVar26 * -2 + 1) * 4);
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar20 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              local_b0.exp = (local_1d0->m_backend).exp;
              local_b0.neg = (local_1d0->m_backend).neg;
              fVar4 = (local_1d0->m_backend).fpclass;
              iVar7 = (local_1d0->m_backend).prec_elem;
              local_b0.fpclass = fVar4;
              local_b0.prec_elem = iVar7;
              if ((bStack_294 == true) &&
                 (local_308._0_4_ != 0 || (fpclass_type)local_290 != cpp_dec_float_finite)) {
                bStack_294 = false;
              }
              if ((fVar4 != cpp_dec_float_NaN && (fpclass_type)local_290 != cpp_dec_float_NaN) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_308,&local_b0),
                 0 < iVar10)) {
                puVar22 = (uint *)local_288;
                pnVar21 = pnVar18;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pnVar21->m_backend).data._M_elems[0] = *puVar22;
                  puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
                  pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar21 + ((ulong)bVar26 * -2 + 1) * 4);
                }
                (pnVar18->m_backend).exp = iStack_218;
                (pnVar18->m_backend).neg = bStack_214;
                (pnVar18->m_backend).fpclass = (fpclass_type)local_210;
                (pnVar18->m_backend).prec_elem = local_210._4_4_;
                lVar15 = (long)local_314;
                local_314 = local_314 + 1;
                local_1f8[lVar15] = iVar11;
              }
            }
            piVar13 = local_1c0 + 1;
            pcVar17 = pcVar17 + 1;
            iVar9 = iVar9 + -1;
          } while ((int)local_1c8 < iVar9);
        }
      }
      else {
        local_290._0_4_ = cpp_dec_float_finite;
        local_290._4_4_ = 0x1c;
        local_308 = (undefined1  [16])0x0;
        local_2f8 = (undefined1  [16])0x0;
        local_2e8 = (undefined1  [16])0x0;
        local_2d8 = (undefined1  [16])0x0;
        local_2c8 = (undefined1  [16])0x0;
        local_2b8 = (undefined1  [16])0x0;
        local_2a8 = SUB1613((undefined1  [16])0x0,0);
        uStack_29b = 0;
        iStack_298 = 0;
        bStack_294 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_308,0.0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_130,(cpp_dec_float<200U,_int,_void> *)local_308);
        if (iVar9 != 0) goto LAB_0053ed84;
      }
      lVar15 = local_1d8;
    } while (local_1e0 < local_1d8);
  }
  return local_314;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R x, y;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      assert(i >= 0 && i < l.size);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  nonz[n++] = m;
               }
            }
            else
            {
               y -= x * (*val++);
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}